

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O0

wasm_mutability_t wasm_globaltype_mutability(wasm_globaltype_t *type)

{
  wasm_mutability_t wVar1;
  GlobalType *pGVar2;
  wasm_globaltype_t *type_local;
  
  if (type != (wasm_globaltype_t *)0x0) {
    pGVar2 = wasm_externtype_t::As<wabt::interp::GlobalType>(&type->super_wasm_externtype_t);
    wVar1 = FromWabtMutability(pGVar2->mut);
    return wVar1;
  }
  __assert_fail("type",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/interp/interp-wasm-c-api.cc"
                ,0x376,"wasm_mutability_t wasm_globaltype_mutability(const wasm_globaltype_t *)");
}

Assistant:

wasm_mutability_t wasm_globaltype_mutability(const wasm_globaltype_t* type) {
  assert(type);
  return FromWabtMutability(type->As<GlobalType>()->mut);
}